

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toggle.cpp
# Opt level: O0

Element __thiscall ftxui::anon_unknown_3::ToggleBase::Render(ToggleBase *this)

{
  ulong uVar1;
  size_t sVar2;
  int *piVar3;
  reference box;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ToggleBase *in_RSI;
  Element EVar4;
  _func_shared_ptr<ftxui::Node>_shared_ptr<ftxui::Node> *local_200;
  _func_shared_ptr<ftxui::Node>_shared_ptr<ftxui::Node> *local_1f8;
  ToggleOption *local_1e8;
  ToggleOption *local_1d8;
  ToggleOption *local_1c8;
  byte local_1b1;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_168;
  Decorator local_150;
  Decorator local_130;
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> local_110;
  string local_f0;
  Element local_d0;
  Element local_c0;
  Element local_b0;
  value_type local_a0;
  _func_shared_ptr<ftxui::Node>_shared_ptr<ftxui::Node> *local_90;
  _func_Element_Element *focus_management;
  Decorator style;
  undefined1 local_60 [6];
  bool is_selected;
  bool is_focused;
  ulong local_50;
  size_t i;
  byte local_31;
  undefined1 local_30 [7];
  bool is_toggle_focused;
  Elements children;
  ToggleBase *this_local;
  
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            ((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )local_30);
  local_31 = ComponentBase::Focused(&in_RSI->super_ComponentBase);
  sVar2 = ConstStringListRef::size(&in_RSI->entries_);
  std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::resize(&in_RSI->boxes_,sVar2);
  local_50 = 0;
  while( true ) {
    uVar1 = local_50;
    sVar2 = ConstStringListRef::size(&in_RSI->entries_);
    if (sVar2 <= uVar1) break;
    if (local_50 != 0) {
      separator();
      std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
      push_back((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                 *)local_30,(value_type *)local_60);
      std::shared_ptr<ftxui::Node>::~shared_ptr((shared_ptr<ftxui::Node> *)local_60);
    }
    piVar3 = focused_entry(in_RSI);
    local_1b1 = 0;
    if (*piVar3 == (int)local_50) {
      local_1b1 = local_31;
    }
    style._M_invoker._7_1_ = local_1b1 & 1;
    style._M_invoker._6_1_ = *in_RSI->selected_ == (int)local_50;
    if ((bool)style._M_invoker._6_1_) {
      if (style._M_invoker._7_1_ == 0) {
        local_1c8 = Ref<ftxui::ToggleOption>::operator->(&in_RSI->option_);
        local_1c8 = (ToggleOption *)&local_1c8->style_selected;
      }
      else {
        local_1c8 = Ref<ftxui::ToggleOption>::operator->(&in_RSI->option_);
        local_1c8 = (ToggleOption *)&local_1c8->style_selected_focused;
      }
      local_1d8 = local_1c8;
    }
    else {
      if (style._M_invoker._7_1_ == 0) {
        local_1e8 = Ref<ftxui::ToggleOption>::operator->(&in_RSI->option_);
      }
      else {
        local_1e8 = Ref<ftxui::ToggleOption>::operator->(&in_RSI->option_);
        local_1e8 = (ToggleOption *)&local_1e8->style_focused;
      }
      local_1d8 = local_1e8;
    }
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
               &focus_management,&local_1d8->style_normal);
    if ((style._M_invoker._6_1_ & 1) == 0) {
      local_1f8 = nothing;
    }
    else {
      if ((local_31 & 1) == 0) {
        local_200 = select;
      }
      else {
        local_200 = focus;
      }
      local_1f8 = local_200;
    }
    local_90 = local_1f8;
    ConstStringListRef::operator[][abi_cxx11_(&local_f0,&in_RSI->entries_,local_50);
    text((ftxui *)&local_d0,&local_f0);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              (&local_110,
               (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
               &focus_management);
    operator|((ftxui *)&local_c0,&local_d0,&local_110);
    std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
    function<std::shared_ptr<ftxui::Node>(*&)(std::shared_ptr<ftxui::Node>),void>
              ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_130,
               &local_90);
    operator|((ftxui *)&local_b0,&local_c0,&local_130);
    box = std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::operator[](&in_RSI->boxes_,local_50)
    ;
    reflect(&local_150,box);
    operator|((ftxui *)&local_a0,&local_b0,&local_150);
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    push_back((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
               *)local_30,&local_a0);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_a0);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
              (&local_150);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_b0);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
              (&local_130);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_c0);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
              (&local_110);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
              ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
               &focus_management);
    local_50 = local_50 + 1;
  }
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_168,
             (vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )local_30);
  hbox((ftxui *)this,&local_168);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_168);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            ((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )local_30);
  EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    Elements children;
    bool is_toggle_focused = Focused();
    boxes_.resize(entries_.size());
    for (size_t i = 0; i < entries_.size(); ++i) {
      // Separator.
      if (i != 0)
        children.push_back(separator());

      bool is_focused = (focused_entry() == int(i)) && is_toggle_focused;
      bool is_selected = (*selected_ == int(i));

      auto style = is_selected ? (is_focused ? option_->style_selected_focused
                                             : option_->style_selected)
                               : (is_focused ? option_->style_focused
                                             : option_->style_normal);
      auto focus_management = !is_selected        ? nothing
                              : is_toggle_focused ? focus
                                                  : select;
      children.push_back(text(entries_[i]) | style | focus_management |
                         reflect(boxes_[i]));
    }
    return hbox(std::move(children));
  }